

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

OggOpusFile * op_vtest_url(char *_url,int *_error,__va_list_tag *_ap)

{
  void *_stream;
  OggOpusFile *pOVar1;
  OpusServerInfo *pinfo;
  OpusServerInfo info;
  OpusFileCallbacks cb;
  OpusServerInfo *local_78;
  OpusServerInfo local_70;
  OpusFileCallbacks local_30;
  
  _stream = op_url_stream_vcreate_impl(&local_30,_url,&local_70,&local_78,_ap);
  if (_stream == (void *)0x0) {
    if (_error != (int *)0x0) {
      *_error = -0x81;
    }
    pOVar1 = (OggOpusFile *)0x0;
  }
  else {
    pOVar1 = op_test_callbacks(_stream,&local_30,(uchar *)0x0,0,_error);
    if (pOVar1 == (OggOpusFile *)0x0) {
      if (local_78 != (OpusServerInfo *)0x0) {
        opus_server_info_clear(&local_70);
      }
      (*local_30.close)(_stream);
    }
    else if (local_78 != (OpusServerInfo *)0x0) {
      local_78->bitrate_kbps = local_70.bitrate_kbps;
      local_78->is_public = local_70.is_public;
      local_78->is_ssl = local_70.is_ssl;
      *(undefined4 *)&local_78->field_0x3c = local_70._60_4_;
      local_78->server = local_70.server;
      local_78->content_type = local_70.content_type;
      local_78->genre = local_70.genre;
      local_78->url = local_70.url;
      local_78->name = local_70.name;
      local_78->description = local_70.description;
    }
  }
  return pOVar1;
}

Assistant:

OggOpusFile *op_vtest_url(const char *_url,int *_error,va_list _ap){
  OpusFileCallbacks  cb;
  OggOpusFile       *of;
  OpusServerInfo     info;
  OpusServerInfo    *pinfo;
  void              *source;
  source=op_url_stream_vcreate_impl(&cb,_url,&info,&pinfo,_ap);
  if(OP_UNLIKELY(source==NULL)){
    OP_ASSERT(pinfo==NULL);
    if(_error!=NULL)*_error=OP_EFAULT;
    return NULL;
  }
  of=op_test_callbacks(source,&cb,NULL,0,_error);
  if(OP_UNLIKELY(of==NULL)){
    if(pinfo!=NULL)opus_server_info_clear(&info);
    (*cb.close)(source);
  }
  else if(pinfo!=NULL)*pinfo=*&info;
  return of;
}